

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack1_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 1;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 1 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 2 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *in >> 3 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *in >> 4 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *in >> 5 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *in >> 6 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *in >> 7 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = *in >> 8 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = *in >> 9 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = *in >> 10 & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = *in >> 0xb & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = *in >> 0xc & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = *in >> 0xd & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = *in >> 0xe & 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = *in >> 0xf & 1;
  *puVar1 = base + *puVar1;
  return in + 1;
}

Assistant:

uint32_t * unpack1_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  5  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  11  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   & 1  ;
    *out += base;
    out++;
    *out = ( (*in) >>  15  )   & 1  ;
    *out += base;
    out++;

    return in + 1;
}